

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall
JetHead::ServerSocket::accept(ServerSocket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  Socket *pSStack_18;
  int res;
  Socket *new_sock;
  ServerSocket *this_local;
  
  pSStack_18 = (Socket *)0x0;
  iVar1 = Socket::getFd(&this->super_Socket);
  iVar1 = ::accept(iVar1,(sockaddr *)0x0,(socklen_t *)0x0);
  if (iVar1 == -1) {
    jh_log_print(3,"Socket *JetHead::ServerSocket::accept()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x36b,"Accept failed");
  }
  else {
    pSStack_18 = (Socket *)
                 operator_new(0x70,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                              ,0x365);
    Socket::Socket(pSStack_18,iVar1);
    Socket::setConnected(pSStack_18,true,1);
    Socket::setParent(pSStack_18,&this->super_Socket);
  }
  return (int)pSStack_18;
}

Assistant:

Socket *ServerSocket::accept()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	Socket *new_sock = NULL;
	
	int res = ::accept( getFd(), NULL, NULL );

	if ( res != -1 )
	{
		new_sock = jh_new Socket( res );
		new_sock->setConnected( true );
		new_sock->setParent(this);
	}
	else
	{
		LOG_WARN_PERROR("Accept failed");
	}
	
	return new_sock;
}